

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O1

void __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,false>>>
::_container_insert<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>
          (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,false>>>
           *this,set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *column,
          Index pos,Dimension dim)

{
  _Rb_tree_header *p_Var1;
  pointer pEVar2;
  pointer pEVar3;
  Column_hook *pCVar4;
  node_ptr to_erase;
  long lVar5;
  pointer pEVar6;
  _Base_ptr p_Var7;
  ID_index pivot;
  Index local_70;
  _Rb_tree_color local_6c;
  undefined1 local_68 [40];
  pointer pEStack_40;
  uint local_34;
  
  p_Var1 = &(column->_M_t)._M_impl.super__Rb_tree_header;
  local_70 = pos;
  lVar5 = std::_Rb_tree_decrement(&p_Var1->_M_header);
  local_34 = *(uint *)(lVar5 + 0x20);
  std::__detail::
  _Insert_base<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::try_emplace<unsigned_int_const&,unsigned_int&>
            ((_Insert_base<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)(this + 0xa8),(const_iterator)0x0,&local_34,&local_70);
  local_68._24_8_ = *(undefined8 *)(this + 0xe8);
  p_Var7 = (column->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_68._0_4_ = dim;
  if ((_Rb_tree_header *)p_Var7 == p_Var1) {
    local_68._4_4_ = 0xffffffff;
  }
  else {
    lVar5 = std::_Rb_tree_decrement(&p_Var1->_M_header);
    local_68._4_4_ = *(ID_index *)(lVar5 + 0x20);
  }
  pEVar2 = (pointer)(local_68 + 0x20);
  local_68._8_4_ = 0xffffffff;
  local_68._16_8_ = (Field_operators *)0x0;
  local_68._32_8_ = pEVar2;
  pEStack_40 = pEVar2;
  if ((_Rb_tree_header *)p_Var7 != p_Var1) {
    do {
      local_6c = p_Var7[1]._M_color;
      pEVar6 = Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,false>>>>
               ::construct<unsigned_int&>
                         ((Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,false>>>>
                           *)local_68._24_8_,&local_6c);
      if ((pEVar6->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_ !=
          (node_ptr)0x0) {
        __assert_fail("!safemode_or_autounlink || node_algorithms::inited(to_insert)",
                      "/usr/include/boost/intrusive/list.hpp",0x33c,
                      "iterator boost::intrusive::list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, true, false, false>>>, boost::intrusive::list_node_traits<void *>, boost::intrusive::safe_link, Gudhi::persistence_matrix::Matrix<Chain_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, true, false, false>>::Matrix_column_tag, 1>, unsigned long, false, void>::insert(const_iterator, reference) [ValueTraits = boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, true, false, false>>>, boost::intrusive::list_node_traits<void *>, boost::intrusive::safe_link, Gudhi::persistence_matrix::Matrix<Chain_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, true, false, false>>::Matrix_column_tag, 1>, SizeType = unsigned long, ConstantTimeSize = false, HeaderHolder = void]"
                     );
      }
      (pEVar6->super_Column_hook).super_type.super_type.super_list_node<void_*>.prev_ =
           (node_ptr)pEStack_40;
      (pEVar6->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_ =
           (node_ptr)pEVar2;
      pCVar4 = &pEStack_40->super_Column_hook;
      pEStack_40 = pEVar6;
      (pCVar4->super_type).super_type.super_list_node<void_*>.next_ = (node_ptr)pEVar6;
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != p_Var1);
  }
  std::__detail::
  _Insert_base<unsigned_int,std::pair<unsigned_int_const,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,false>>>>,std::allocator<std::pair<unsigned_int_const,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,false>>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  try_emplace<unsigned_int_const&,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,false>>>>
            ((_Insert_base<unsigned_int,std::pair<unsigned_int_const,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,false>>>>,std::allocator<std::pair<unsigned_int_const,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,false>>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)(this + 0x70),(const_iterator)0x0,&local_70,
             (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false>_>_>
              *)local_68);
  pEVar6 = (pointer)local_68._32_8_;
  while (pEVar6 != pEVar2) {
    pEVar3 = (pointer)(pEVar6->super_Column_hook).super_type.super_type.super_list_node<void_*>.
                      next_;
    (pEVar6->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_ = (node_ptr)0x0;
    (pEVar6->super_Column_hook).super_type.super_type.super_list_node<void_*>.prev_ = (node_ptr)0x0;
    Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false>_>_>_>
    ::destroy((Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false>_>_>_>
               *)local_68._24_8_,pEVar6);
    pEVar6 = pEVar3;
  }
  return;
}

Assistant:

inline void Chain_matrix<Master_matrix>::_container_insert(const Container& column, Index pos, Dimension dim)
{
  ID_index pivot;
  if constexpr (Master_matrix::Option_list::is_z2) {
    pivot = *(column.rbegin());
  } else {
    pivot = column.rbegin()->first;
  }
  if constexpr (Master_matrix::Option_list::has_map_column_container) {
    pivotToColumnIndex_.try_emplace(pivot, pos);
    if constexpr (Master_matrix::Option_list::has_row_access) {
      matrix_.try_emplace(pos, Column(pos, column, dim, RA_opt::rows_, colSettings_));
    } else {
      matrix_.try_emplace(pos, Column(column, dim, colSettings_));
    }
  } else {
    if constexpr (Master_matrix::Option_list::has_row_access) {
      matrix_.emplace_back(pos, column, dim, RA_opt::rows_, colSettings_);
    } else {
      matrix_.emplace_back(column, dim, colSettings_);
    }
    pivotToColumnIndex_[pivot] = pos;
  }
}